

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

ps_lattice_t * ps_lattice_read(ps_decoder_t *ps,char *file)

{
  float64 fVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int32 iVar5;
  s3wid_t sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ps_lattice_t *dag;
  dict_t *pdVar10;
  logmath_t *plVar11;
  long lVar12;
  listelem_alloc_t *plVar13;
  FILE *fh;
  lineiter_t *li;
  char *pcVar14;
  ps_latnode_t *ppVar15;
  char *fmt;
  void *ptr;
  double dVar16;
  int sf;
  int seqid;
  int32 ispipe;
  float64 lb;
  int lef;
  int fef;
  char wd [256];
  frame_idx_t local_184;
  void *local_180;
  uint local_174;
  float local_170;
  int32 local_16c;
  ps_latnode_t **local_168;
  float64 local_160;
  FILE *local_158;
  double local_150;
  uint local_144;
  int32 local_140;
  int32 local_13c;
  int local_138 [66];
  
  dag = (ps_lattice_t *)
        __ckd_calloc__(1,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                       ,0x192);
  if (ps == (ps_decoder_t *)0x0) {
    pdVar10 = dict_init((ps_config_t *)0x0,(bin_mdef_t *)0x0);
    dag->dict = pdVar10;
    plVar11 = logmath_init(1.0001,0,0);
    dag->lmath = plVar11;
    iVar5 = 100;
  }
  else {
    dag->search = ps->search;
    pdVar10 = dict_retain(ps->dict);
    dag->dict = pdVar10;
    plVar11 = logmath_retain(ps->lmath);
    dag->lmath = plVar11;
    lVar12 = ps_config_int(dag->search->config,"frate");
    iVar5 = (int32)lVar12;
  }
  dag->frate = iVar5;
  dag->silence = dag->dict->silwid;
  plVar13 = listelem_alloc_init(0x48);
  dag->latnode_alloc = plVar13;
  plVar13 = listelem_alloc_init(0x30);
  dag->latlink_alloc = plVar13;
  plVar13 = listelem_alloc_init(0x10);
  dag->latlink_list_alloc = plVar13;
  dag->refcount = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x1a7,"Reading DAG file: %s\n",file);
  fh = fopen_compchk(file,&local_16c);
  if (fh == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0x1a9,"Failed to open DAG file \'%s\' for reading",file);
    return (ps_lattice_t *)0x0;
  }
  li = lineiter_start(fh);
  if (li == (lineiter_t *)0x0) {
    lVar12 = 0x1b0;
LAB_00111879:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,lVar12,"Premature EOF(%s)\n",file);
    li = (lineiter_t *)0x0;
    ptr = (void *)0x0;
    goto LAB_0011188b;
  }
  pcVar14 = li->buf;
  iVar3 = strncmp(pcVar14,"# getcwd: ",10);
  if (iVar3 != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1b4,"%s does not begin with \'# getcwd: \'\n%s",file,pcVar14);
    ptr = (void *)0x0;
    goto LAB_0011188b;
  }
  li = lineiter_next(li);
  if (li == (lineiter_t *)0x0) {
    lVar12 = 0x1b8;
    goto LAB_00111879;
  }
  pcVar14 = li->buf;
  iVar3 = strncmp(pcVar14,"# -logbase ",0xb);
  if ((iVar3 != 0) || (iVar3 = __isoc99_sscanf(pcVar14 + 0xb,"%lf",&local_160), iVar3 != 1)) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1bd,"%s: Cannot find -logbase in header\n",file);
    local_160 = 1.0001;
  }
  if (dag->lmath == (logmath_t *)0x0) {
    plVar11 = logmath_init(local_160,0,1);
    dag->lmath = plVar11;
LAB_00111a4b:
    local_170 = 1.0;
  }
  else {
    fVar1 = logmath_get_base(dag->lmath);
    if (ABS((double)local_160 - (double)(float)(double)fVar1) < 0.0001) goto LAB_00111a4b;
    local_150 = (double)(float)(double)fVar1;
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1c6,"Inconsistent logbases: %f vs %f: will compensate\n");
    local_168 = (ps_latnode_t **)log((double)local_160);
    dVar16 = log(local_150);
    local_170 = (float)((double)local_168 / dVar16);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1c8,"Lattice log ratio: %f\n",SUB84((double)local_170,0));
  }
  iVar3 = dag_param_read(li,"Frames");
  dag->n_frames = iVar3;
  if (iVar3 < 1) {
    pcVar14 = "Frames parameter missing or invalid\n";
    lVar12 = 0x1ce;
  }
  else {
    uVar4 = dag_param_read(li,"Nodes");
    if (0 < (int)uVar4) {
      local_150 = (double)(ulong)uVar4;
      local_158 = fh;
      local_144 = uVar4;
      local_180 = __ckd_calloc__((size_t)local_150,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                 ,0x1d9);
      local_168 = &dag->nodes;
      dVar16 = 0.0;
      do {
        li = lineiter_next(li);
        if (li == (lineiter_t *)0x0) {
          lVar12 = 0x1e2;
          fmt = "Premature EOF while loading Nodes(%s)\n";
          pcVar14 = file;
LAB_00111cab:
          bVar2 = false;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,lVar12,fmt,pcVar14);
        }
        else {
          uVar4 = __isoc99_sscanf(li->buf,"%d %255s %d %d %d",&local_174,local_138,&local_184,
                                  &local_13c,&local_140);
          if (uVar4 == 5) {
            uVar4 = dict_wordid(dag->dict,(char *)local_138);
            if ((int)uVar4 < 0) {
              if (dag->search == (ps_search_t *)0x0) {
                pcVar14 = __ckd_salloc__((char *)local_138,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                         ,0x1f0);
                iVar5 = dict_word2basestr(pcVar14);
                if ((iVar5 != -1) && (sVar6 = dict_wordid(dag->dict,pcVar14), sVar6 == -1)) {
                  dict_add_word(dag->dict,pcVar14,(s3cipid_t *)0x0,0);
                }
                ckd_free(pcVar14);
                uVar4 = dict_add_word(dag->dict,(char *)local_138,(s3cipid_t *)0x0,0);
              }
              if ((int)uVar4 < 0) {
                lVar12 = 0x1f9;
                fmt = "Unknown word in line: %s\n";
                pcVar14 = li->buf;
                goto LAB_00111cab;
              }
            }
            if (dVar16 != (double)(ulong)local_174) {
              lVar12 = 0x1ff;
              fmt = "Seqno error: %s\n";
              pcVar14 = li->buf;
              goto LAB_00111cab;
            }
            ppVar15 = (ps_latnode_t *)
                      __listelem_malloc__(dag->latnode_alloc,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                          ,0x203);
            *local_168 = ppVar15;
            *(ps_latnode_t **)((long)local_180 + (long)dVar16 * 8) = ppVar15;
            ppVar15->wid = uVar4;
            ppVar15->basewid = dag->dict->word[uVar4].basewid;
            ppVar15->id = local_174;
            ppVar15->sf = local_184;
            ppVar15->fef = local_13c;
            ppVar15->lef = local_140;
            ppVar15->reachable = 0;
            local_168 = &ppVar15->next;
            ppVar15->next = (ps_latnode_s *)0x0;
            ppVar15->exits = (latlink_list_t *)0x0;
            ppVar15->entries = (latlink_list_t *)0x0;
            bVar2 = true;
          }
          else {
            bVar2 = false;
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                    ,0x1e9,"Cannot parse line: %s, value of count %d\n",li->buf,(ulong)uVar4);
          }
        }
        ptr = local_180;
        fh = local_158;
        if (!bVar2) goto LAB_0011188b;
        dVar16 = (double)((long)dVar16 + 1);
      } while (local_150 != dVar16);
      uVar7 = dag_param_read(li,"Initial");
      uVar4 = local_144;
      ptr = local_180;
      if (local_144 <= uVar7) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x215,"Initial node parameter missing or invalid\n");
        ptr = local_180;
        fh = local_158;
        goto LAB_0011188b;
      }
      dag->start = *(ps_latnode_t **)((long)local_180 + (ulong)uVar7 * 8);
      uVar7 = dag_param_read(li,"Final");
      fh = local_158;
      if (uVar4 <= uVar7) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x21d,"Final node parameter missing or invalid\n");
        goto LAB_0011188b;
      }
      dag->end = *(ps_latnode_t **)((long)ptr + (ulong)uVar7 * 8);
      iVar3 = dag_param_read(li,"BestSegAscr");
      if (iVar3 < 0) {
        pcVar14 = "BestSegAscr parameter missing\n";
        lVar12 = 0x224;
      }
      else {
        for (; iVar3 != 0; iVar3 = iVar3 + -1) {
          li = lineiter_next(li);
          if (li == (lineiter_t *)0x0) {
            li = (lineiter_t *)0x0;
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                    ,0x22a,"Premature EOF while (%s) ignoring BestSegAscr\n",0);
            ptr = local_180;
            goto LAB_0011188b;
          }
        }
        for (li = lineiter_next(li); li != (lineiter_t *)0x0; li = lineiter_next(li)) {
          if ((*li->buf != '#') && (iVar3 = strncmp(li->buf,"Edges",5), iVar3 == 0))
          goto LAB_00111ed1;
        }
        pcVar14 = "Edges missing\n";
        li = (lineiter_t *)0x0;
        lVar12 = 0x237;
      }
      goto LAB_00111f21;
    }
    pcVar14 = "Nodes parameter missing or invalid\n";
    lVar12 = 0x1d4;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,lVar12,pcVar14);
  ptr = (void *)0x0;
  goto LAB_0011188b;
LAB_00111ed1:
  while ((li = lineiter_next(li), li != (lineiter_t *)0x0 &&
         (iVar3 = __isoc99_sscanf(li->buf,"%d %d %d",local_138,&local_174,&local_184), iVar3 == 3)))
  {
    if (-0x20000001 < local_184) {
      if ((local_170 != 1.0) || (NAN(local_170))) {
        local_184 = (frame_idx_t)((float)local_184 * local_170);
      }
      ppVar15 = *(ps_latnode_t **)((long)local_180 + (long)(int)local_174 * 8);
      ps_lattice_link(dag,*(ps_latnode_t **)((long)local_180 + (long)local_138[0] * 8),ppVar15,
                      local_184,ppVar15->sf + -1);
    }
  }
  iVar3 = strcmp(li->buf,"End\n");
  if (iVar3 == 0) {
    lineiter_free(li);
    fclose_comp(fh,local_16c);
    ckd_free(local_180);
    iVar3 = dict_filler_word(dag->dict,dag->end->wid);
    if (iVar3 != 0) {
      if (dag->search == (ps_search_t *)0x0) {
        sVar6 = dict_wordid(dag->dict,"</s>");
      }
      else {
        sVar6 = dag->search->finish_wid;
      }
      dag->end->basewid = sVar6;
    }
    dag_mark_reachable(dag->end);
    ps_lattice_delete_unreachable(dag);
    if (ps == (ps_decoder_t *)0x0) {
      return dag;
    }
    plVar11 = dag->lmath;
    dVar16 = ps_config_float(ps->config,"pip");
    iVar3 = logmath_log(plVar11,(float64)dVar16);
    plVar11 = dag->lmath;
    dVar16 = ps_config_float(ps->config,"silprob");
    iVar8 = logmath_log(plVar11,(float64)dVar16);
    plVar11 = dag->lmath;
    dVar16 = ps_config_float(ps->config,"fillprob");
    iVar9 = logmath_log(plVar11,(float64)dVar16);
    ps_lattice_penalize_fillers(dag,iVar8 + iVar3,iVar3 + iVar9);
    return dag;
  }
  pcVar14 = "Terminating \'End\' missing\n";
  lVar12 = 0x24a;
LAB_00111f21:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,lVar12,pcVar14);
  ptr = local_180;
LAB_0011188b:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x26f,"Failed to load %s\n",file);
  lineiter_free(li);
  fclose_comp(fh,local_16c);
  ckd_free(ptr);
  return (ps_lattice_t *)0x0;
}

Assistant:

ps_lattice_t *
ps_lattice_read(ps_decoder_t *ps,
                char const *file)
{
    FILE *fp;
    int32 ispipe;
    lineiter_t *line;
    float64 lb;
    float32 logratio;
    ps_latnode_t **darray;
    ps_lattice_t *dag;
    int i, k, n_nodes;
    int32 pip, silpen, fillpen;
    ps_latnode_t **pnodes;

    dag = ckd_calloc(1, sizeof(*dag));

    if (ps) {
        dag->search = ps->search;
        dag->dict = dict_retain(ps->dict);
        dag->lmath = logmath_retain(ps->lmath);
        dag->frate = ps_config_int(dag->search->config, "frate");
    }
    else {
        dag->dict = dict_init(NULL, NULL);
        dag->lmath = logmath_init(1.0001, 0, FALSE);
        dag->frate = 100;
    }
    dag->silence = dict_silwid(dag->dict);
    dag->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));
    dag->latlink_alloc = listelem_alloc_init(sizeof(ps_latlink_t));
    dag->latlink_list_alloc = listelem_alloc_init(sizeof(latlink_list_t));
    dag->refcount = 1;

    darray = NULL;

    E_INFO("Reading DAG file: %s\n", file);
    if ((fp = fopen_compchk(file, &ispipe)) == NULL) {
        E_ERROR_SYSTEM("Failed to open DAG file '%s' for reading", file);
        return NULL;
    }
    line = lineiter_start(fp);

    /* Read and verify logbase (ONE BIG HACK!!) */
    if (line == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if (strncmp(line->buf, "# getcwd: ", 10) != 0) {
        E_ERROR("%s does not begin with '# getcwd: '\n%s", file, line->buf);
        goto load_error;
    }
    if ((line = lineiter_next(line)) == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if ((strncmp(line->buf, "# -logbase ", 11) != 0)
        || (sscanf(line->buf + 11, "%lf", &lb) != 1)) {
        E_WARN("%s: Cannot find -logbase in header\n", file);
        lb = 1.0001;
    }
    logratio = 1.0f;
    if (dag->lmath == NULL)
        dag->lmath = logmath_init(lb, 0, TRUE);
    else {
        float32 pb = logmath_get_base(dag->lmath);
        if (fabs(lb - pb) >= 0.0001) {
            E_WARN("Inconsistent logbases: %f vs %f: will compensate\n", lb, pb);
            logratio = (float32)(log(lb) / log(pb));
            E_INFO("Lattice log ratio: %f\n", logratio);
        }
    }
    /* Read Frames parameter */
    dag->n_frames = dag_param_read(line, "Frames");
    if (dag->n_frames <= 0) {
        E_ERROR("Frames parameter missing or invalid\n");
        goto load_error;
    }
    /* Read Nodes parameter */
    n_nodes = dag_param_read(line, "Nodes");
    if (n_nodes <= 0) {
        E_ERROR("Nodes parameter missing or invalid\n");
        goto load_error;
    }

    /* Read nodes */
    darray = ckd_calloc(n_nodes, sizeof(*darray));
    pnodes = &dag->nodes;
    for (i = 0; i < n_nodes; i++) {
        int32 w;
        int seqid, sf, fef, lef;
        char wd[256];
        ps_latnode_t *node;

        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while loading Nodes(%s)\n", file);
            goto load_error;
        }

        if ((k =
             sscanf(line->buf, "%d %255s %d %d %d", &seqid, wd, &sf, &fef,
                    &lef)) != 5) {
            E_ERROR("Cannot parse line: %s, value of count %d\n", line->buf, k);
            goto load_error;
        }

        w = dict_wordid(dag->dict, wd);
        if (w < 0) {
            if (dag->search == NULL) {
                char *ww = ckd_salloc(wd);
                if (dict_word2basestr(ww) != -1) {
                    if (dict_wordid(dag->dict, ww) == BAD_S3WID)
                        dict_add_word(dag->dict, ww, NULL, 0);
                }
                ckd_free(ww);
                w = dict_add_word(dag->dict, wd, NULL, 0);
            }
            if (w < 0) {
                E_ERROR("Unknown word in line: %s\n", line->buf);
                goto load_error;
            }
        }

        if (seqid != i) {
            E_ERROR("Seqno error: %s\n", line->buf);
            goto load_error;
        }

        *pnodes = listelem_malloc(dag->latnode_alloc);
        node = *pnodes;
        darray[i] = node;
        node->wid = w;
        node->basewid = dict_basewid(dag->dict, w);
        node->id = seqid;
        node->sf = sf;
        node->fef = fef;
        node->lef = lef;
        node->reachable = 0;
        node->exits = node->entries = NULL;
        node->next = NULL;
        pnodes = &node->next;
    }

    /* Read initial node ID */
    k = dag_param_read(line, "Initial");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Initial node parameter missing or invalid\n");
        goto load_error;
    }
    dag->start = darray[k];

    /* Read final node ID */
    k = dag_param_read(line, "Final");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Final node parameter missing or invalid\n");
        goto load_error;
    }
    dag->end = darray[k];

    /* Read bestsegscore entries and ignore them. */
    if ((k = dag_param_read(line, "BestSegAscr")) < 0) {
        E_ERROR("BestSegAscr parameter missing\n");
        goto load_error;
    }
    for (i = 0; i < k; i++) {
        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while (%s) ignoring BestSegAscr\n",
                    line);
            goto load_error;
        }
    }

    /* Read in edges. */
    while ((line = lineiter_next(line)) != NULL) {
        if (line->buf[0] == '#')
            continue;
        if (0 == strncmp(line->buf, "Edges", 5))
            break;
    }
    if (line == NULL) {
        E_ERROR("Edges missing\n");
        goto load_error;
    }
    while ((line = lineiter_next(line)) != NULL) {
        int from, to, ascr;
        ps_latnode_t *pd, *d;

        if (sscanf(line->buf, "%d %d %d", &from, &to, &ascr) != 3)
            break;
        if (ascr WORSE_THAN WORST_SCORE)
            continue;
        pd = darray[from];
        d = darray[to];
        if (logratio != 1.0f)
            /* FIXME: possible under/overflow!!! */
            ascr = (int32)(ascr * logratio);
        ps_lattice_link(dag, pd, d, ascr, d->sf - 1);
    }
    if (strcmp(line->buf, "End\n") != 0) {
        E_ERROR("Terminating 'End' missing\n");
        goto load_error;
    }
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(dag->dict, dag->end->wid))
        dag->end->basewid = dag->search
            ? ps_search_finish_wid(dag->search)
            : dict_wordid(dag->dict, S3_FINISH_WORD);

    /* Mark reachable from dag->end */
    dag_mark_reachable(dag->end);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    if (ps) {
        /* Build links around silence and filler words, since they do
         * not exist in the language model.  FIXME: This is
         * potentially buggy, as we already do this before outputting
         * lattices. */
        pip = logmath_log(dag->lmath, ps_config_float(ps->config, "pip"));
        silpen = pip + logmath_log(dag->lmath,
                                   ps_config_float(ps->config, "silprob"));
        fillpen = pip + logmath_log(dag->lmath,
                                    ps_config_float(ps->config, "fillprob"));
        ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }

    return dag;

  load_error:
    E_ERROR("Failed to load %s\n", file);
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);
    return NULL;
}